

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O1

UVec4 __thiscall
deqp::gles3::Functional::RandomFragmentOpCase::getCompareThreshold(RandomFragmentOpCase *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int i_1;
  RenderTarget *pRVar5;
  uint uVar6;
  uint uVar7;
  char cVar8;
  undefined8 uVar9;
  Vector<unsigned_int,_4> *res_1;
  char cVar10;
  long in_RSI;
  char cVar11;
  uint uVar12;
  int i;
  long lVar13;
  IVec4 IVar14;
  UVec4 UVar15;
  Vector<unsigned_int,_4> res;
  Vector<unsigned_int,_4> res_2;
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  int aiStack_28 [4];
  
  pRVar5 = Context::getRenderTarget(*(Context **)(in_RSI + 0x70));
  uVar1 = (pRVar5->m_pixelFormat).redBits;
  uVar2 = (pRVar5->m_pixelFormat).greenBits;
  uVar3 = (pRVar5->m_pixelFormat).blueBits;
  iVar4 = (pRVar5->m_pixelFormat).alphaBits;
  uVar6 = uVar1 ^ 8;
  uVar12 = uVar2 ^ 8;
  uVar7 = uVar3 ^ 8;
  cVar11 = (char)uVar1;
  cVar10 = (char)uVar2;
  cVar8 = (char)uVar3;
  if ((iVar4 == 8 && (uVar7 == 0 && (uVar12 == 0 && uVar6 == 0))) ||
     ((uVar7 == 0 && (uVar12 == 0 && uVar6 == 0)) && iVar4 == 0)) {
    lVar13 = 0;
    local_48[0] = 0x1000000 << (8U - (char)iVar4 & 0x1f);
    if (iVar4 < 1) {
      local_48[0] = 0;
    }
    local_48[0] = 0x100 << (8U - cVar10 & 0x1f) | 1 << ((byte)(8 - cVar11) & 0x1f) |
                  0x10000 << (8U - cVar8 & 0x1f) | local_48[0];
    IVar14 = tcu::RGBA::toIVec((RGBA *)&local_58);
    uVar9 = IVar14.m_data._8_8_;
    local_78 = local_58;
    uStack_70 = uStack_50;
    do {
      *(undefined4 *)((long)&local_38 + lVar13 * 4) = 2;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    lVar13 = 0;
    do {
      *(int *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
              lVar13 * 4) =
           *(int *)((long)&local_38 + lVar13 * 4) + *(int *)((long)&local_78 + lVar13 * 4);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
  }
  else {
    lVar13 = 0;
    local_5c = 0x1000000 << (8U - (char)iVar4 & 0x1f);
    if (iVar4 < 1) {
      local_5c = 0;
    }
    local_5c = 0x100 << (8U - cVar10 & 0x1f) | 1 << ((byte)(8 - cVar11) & 0x1f) |
               0x10000 << (8U - cVar8 & 0x1f) | local_5c;
    IVar14 = tcu::RGBA::toIVec((RGBA *)&local_38);
    uVar9 = IVar14.m_data._8_8_;
    local_58 = local_38;
    uStack_50 = uStack_30;
    do {
      local_48[lVar13] = 5;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    local_78 = 0;
    uStack_70 = 0;
    lVar13 = 0;
    do {
      *(uint *)((long)&local_78 + lVar13 * 4) =
           local_48[lVar13] * *(int *)((long)&local_58 + lVar13 * 4);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    lVar13 = 0;
    do {
      aiStack_28[lVar13] = 2;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    lVar13 = 0;
    do {
      *(int *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
              lVar13 * 4) = aiStack_28[lVar13] + *(int *)((long)&local_78 + lVar13 * 4);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
  }
  UVar15.m_data[2] = (int)uVar9;
  UVar15.m_data[3] = (int)((ulong)uVar9 >> 0x20);
  UVar15.m_data._0_8_ = this;
  return (UVec4)UVar15.m_data;
}

Assistant:

tcu::UVec4 RandomFragmentOpCase::getCompareThreshold (void) const
{
	tcu::PixelFormat format = m_context.getRenderTarget().getPixelFormat();

	if (format == tcu::PixelFormat(8, 8, 8, 8) || format == tcu::PixelFormat(8, 8, 8, 0))
		return format.getColorThreshold().toIVec().asUint() + tcu::UVec4(2); // Default threshold.
	else
		return format.getColorThreshold().toIVec().asUint()
			   * tcu::UVec4(5) + tcu::UVec4(2); // \note Non-scientific ad hoc formula. Need big threshold when few color bits; especially multiple blendings bring extra inaccuracy.
}